

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int lhCursorLast(unqlite_kv_cursor *pCursor)

{
  unqlite_kv_engine *puVar1;
  int iVar2;
  
  puVar1 = pCursor->pStore;
  if (*(int *)((long)&pCursor[1].pStore + 4) != 0) {
    iVar2 = (*puVar1->pIo->xGet)(puVar1->pIo->pHandle,1,(unqlite_page **)(puVar1 + 0x1a));
    if (iVar2 != 0) {
      return iVar2;
    }
    *(undefined4 *)((long)&pCursor[1].pStore + 4) = 0;
  }
  pCursor[4].pStore = (unqlite_kv_engine *)puVar1[0x1d].pIo;
  iVar2 = lhCursorPrevPage((lhash_kv_cursor *)pCursor);
  return iVar2;
}

Assistant:

static int lhCursorLast(unqlite_kv_cursor *pCursor)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pCursor;
	lhash_kv_engine *pEngine = (lhash_kv_engine *)pCursor->pStore;
	int rc;
	if( pCur->is_first ){
		/* Read the database header first */
		rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,1,&pEngine->pHeader);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		pCur->is_first = 0;
	}
	/* Point to the last map record */
	pCur->pRec = pEngine->pList;
	/* Load the cells */
	rc = lhCursorPrevPage(pCur);
	return rc;
}